

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16c67c::CliqueRunner::post_nogood
          (CliqueRunner *this,vector<int,_std::allocator<int>_> *c)

{
  const_iterator __first;
  const_iterator __last;
  vector<int,_std::allocator<int>_> *in_RDI;
  Nogood<int> nogood;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  
  gss::innards::Nogood<int>::Nogood((Nogood<int> *)0x1a3c76);
  __first = std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  __last = std::vector<int,_std::allocator<int>_>::end(in_RDI);
  std::vector<int,std::allocator<int>>::
  assign<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
            (in_stack_ffffffffffffffc0,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __first._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __last._M_current);
  gss::innards::Watches<int,_(anonymous_namespace)::FlatWatchTable>::post_nogood
            ((Watches<int,_(anonymous_namespace)::FlatWatchTable> *)__first._M_current,
             (Nogood<int> *)__last._M_current);
  gss::innards::Nogood<int>::~Nogood((Nogood<int> *)0x1a3ccb);
  return;
}

Assistant:

auto post_nogood(
            const vector<int> & c)
        {
            Nogood<int> nogood;
            nogood.literals.assign(c.begin(), c.end());
            watches.post_nogood(move(nogood));
        }